

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

void us_socket_remote_address(int ssl,us_socket_t *s,char *buf,int *length)

{
  int iVar1;
  sockaddr local_a8 [8];
  socklen_t local_28 [2];
  char *local_20;
  int local_18;
  
  iVar1 = us_poll_fd(&s->p);
  local_28[0] = 0x80;
  iVar1 = getpeername(iVar1,local_a8,local_28);
  if (iVar1 == 0) {
    if (local_a8[0].sa_family == 10) {
      local_20 = local_a8[0].sa_data + 6;
      local_18 = 0x10;
    }
    else {
      local_18 = 0;
      if (local_a8[0].sa_family == 2) {
        local_20 = local_a8[0].sa_data + 2;
        local_18 = 4;
      }
    }
    if (local_18 <= *length) {
      *length = local_18;
      memcpy(buf,local_20,(long)local_18);
      return;
    }
  }
  *length = 0;
  return;
}

Assistant:

void us_socket_remote_address(int ssl, struct us_socket_t *s, char *buf, int *length) {
    struct bsd_addr_t addr;
    if (bsd_socket_addr(us_poll_fd(&s->p), &addr) || *length < bsd_addr_get_ip_length(&addr)) {
        *length = 0;
    } else {
        *length = bsd_addr_get_ip_length(&addr);
        memcpy(buf, bsd_addr_get_ip(&addr), *length);
    }
}